

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_partial_usingDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              char *dictStart,int dictSize)

{
  char *dictStart_local;
  int dstCapacity_local;
  int targetOutputSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  
  if (dictSize == 0) {
    source_local._4_4_ =
         LZ4_decompress_safe_partial(source,dest,compressedSize,targetOutputSize,dstCapacity);
  }
  else if (dictStart + dictSize == dest) {
    if (dictSize < 0xffff) {
      source_local._4_4_ =
           LZ4_decompress_safe_partial_withSmallPrefix
                     (source,dest,compressedSize,targetOutputSize,dstCapacity,(long)dictSize);
    }
    else {
      source_local._4_4_ =
           LZ4_decompress_safe_partial_withPrefix64k
                     (source,dest,compressedSize,targetOutputSize,dstCapacity);
    }
  }
  else {
    source_local._4_4_ =
         LZ4_decompress_safe_partial_forceExtDict
                   (source,dest,compressedSize,targetOutputSize,dstCapacity,dictStart,(long)dictSize
                   );
  }
  return source_local._4_4_;
}

Assistant:

int LZ4_decompress_safe_partial_usingDict(const char* source, char* dest, int compressedSize, int targetOutputSize, int dstCapacity, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe_partial(source, dest, compressedSize, targetOutputSize, dstCapacity);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_partial_withPrefix64k(source, dest, compressedSize, targetOutputSize, dstCapacity);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_partial_withSmallPrefix(source, dest, compressedSize, targetOutputSize, dstCapacity, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_partial_forceExtDict(source, dest, compressedSize, targetOutputSize, dstCapacity, dictStart, (size_t)dictSize);
}